

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::tessellation::anon_unknown_2::IdentityGeometryShaderTestCase::createInstance
          (IdentityGeometryShaderTestCase *this,Context *context)

{
  vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *this_00;
  PassthroughTestInstance *this_01;
  Vector<float,_4> local_158;
  undefined1 local_148 [64];
  PipelineDescription local_108;
  PipelineDescription local_a0;
  char local_38 [32];
  
  PassthroughTestInstance::Params::Params((Params *)local_148);
  local_148[0] = true;
  local_148._4_4_ = 14.0;
  local_148._8_4_ = 14.0;
  local_148._12_4_ = 14.0;
  local_148._16_4_ = 14.0;
  local_148._20_4_ = 14.0;
  local_148._24_4_ = 14.0;
  local_148._28_4_ = this->m_primitiveType;
  local_148._32_4_ = 4 - (uint)(local_148._28_4_ == TESSPRIMITIVETYPE_TRIANGLES);
  this_00 = (vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)(local_148 + 0x28);
  local_158.m_data[0] = -0.9;
  local_158.m_data[1] = -0.9;
  local_158.m_data[2] = 0.0;
  local_158.m_data[3] = 1.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>(this_00,&local_158);
  local_158.m_data[0] = -0.9;
  local_158.m_data[1] = 0.9;
  local_158.m_data[2] = 0.0;
  local_158.m_data[3] = 1.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>(this_00,&local_158);
  local_158.m_data[0] = 0.9;
  local_158.m_data[1] = -0.9;
  local_158.m_data[2] = 0.0;
  local_158.m_data[3] = 1.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>(this_00,&local_158);
  local_158.m_data._0_8_ = 0x3f6666663f666666;
  local_158.m_data[2] = 0.0;
  local_158.m_data[3] = 1.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>(this_00,&local_158);
  local_108.useTessellation = true;
  local_108.useGeometry = true;
  std::__cxx11::string::assign((char *)&local_108.tessEvalShaderName);
  std::__cxx11::string::assign((char *)&local_108.geomShaderName);
  std::__cxx11::string::assign((char *)&local_108.description);
  local_a0.useTessellation = true;
  local_a0.useGeometry = false;
  std::__cxx11::string::assign((char *)&local_a0.tessEvalShaderName);
  std::__cxx11::string::assign((char *)&local_a0.geomShaderName);
  std::__cxx11::string::assign((char *)&local_a0.description);
  std::__cxx11::string::assign(local_38);
  this_01 = (PassthroughTestInstance *)operator_new(0x140);
  PassthroughTestInstance::PassthroughTestInstance(this_01,context,(Params *)local_148);
  PassthroughTestInstance::Params::~Params((Params *)local_148);
  return &this_01->super_TestInstance;
}

Assistant:

TestInstance* IdentityGeometryShaderTestCase::createInstance (Context& context) const
{
	PassthroughTestInstance::Params params;

	const float level		   = 14.0;
	params.useTessLevels	   = true;
	params.tessLevels.inner[0] = level;
	params.tessLevels.inner[1] = level;
	params.tessLevels.outer[0] = level;
	params.tessLevels.outer[1] = level;
	params.tessLevels.outer[2] = level;
	params.tessLevels.outer[3] = level;

	params.primitiveType	   = m_primitiveType;
	params.inputPatchVertices  = (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 4);

	params.vertices.push_back(tcu::Vec4( -0.9f, -0.9f, 0.0f, 1.0f ));
	params.vertices.push_back(tcu::Vec4( -0.9f,  0.9f, 0.0f, 1.0f ));
	params.vertices.push_back(tcu::Vec4(  0.9f, -0.9f, 0.0f, 1.0f ));
	params.vertices.push_back(tcu::Vec4(  0.9f,  0.9f, 0.0f, 1.0f ));

	params.pipelineCases[0].useTessellation		= true;
	params.pipelineCases[0].useGeometry			= true;
	params.pipelineCases[0].tessEvalShaderName	= "tese_to_geom";
	params.pipelineCases[0].geomShaderName		= "geom";
	params.pipelineCases[0].description			= "passthrough geometry shader";

	params.pipelineCases[1].useTessellation		= true;
	params.pipelineCases[1].useGeometry			= false;
	params.pipelineCases[1].tessEvalShaderName	= "tese_to_frag";
	params.pipelineCases[1].geomShaderName		= "geom";
	params.pipelineCases[1].description			= "no geometry shader in the pipeline";

	params.message = "Testing tessellating shader program output does not change when a passthrough geometry shader is attached.\n"
					 "Rendering two images, first with and second without a geometry shader. Expecting similar results.\n"
					 "Using additive blending to detect overlap.\n";

	return new PassthroughTestInstance(context, params);
}